

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_helpers.hpp
# Opt level: O2

void __thiscall duckdb::QuantileValue::QuantileValue(QuantileValue *this,QuantileValue *param_1)

{
  double dVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  
  Value::Value(&this->val,&param_1->val);
  (this->scaling).upper = (param_1->scaling).upper;
  dVar1 = param_1->dbl;
  uVar2 = (param_1->integral).lower;
  uVar3 = (param_1->scaling).lower;
  (this->integral).upper = (param_1->integral).upper;
  (this->scaling).lower = uVar3;
  this->dbl = dVar1;
  (this->integral).lower = uVar2;
  return;
}

Assistant:

explicit QuantileValue(const Value &v) : val(v), dbl(v.GetValue<double>()) {
		const auto &type = val.type();
		switch (type.id()) {
		case LogicalTypeId::DECIMAL: {
			integral = IntegralValue::Get(v);
			scaling = Hugeint::POWERS_OF_TEN[DecimalType::GetScale(type)];
			break;
		}
		default:
			break;
		}
	}